

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::anon_unknown_0::EmitFieldNonDefaultCondition
               (Printer *printer,string *prefix,FieldDescriptor *field)

{
  CppType CVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  string local_40;
  
  if (*(int *)(field + 0x4c) == 3) {
    if (*(long *)(field + 0x60) == 0) {
      return false;
    }
  }
  else if (*(long *)(field + 0x60) == 0) {
    CVar1 = FieldDescriptor::cpp_type(field);
    if (CVar1 == CPPTYPE_STRING) {
      FieldName_abi_cxx11_(&local_40,(cpp *)field,field_00);
      io::Printer::Print(printer,"if ($prefix$$name$().size() > 0) {\n","prefix",prefix,"name",
                         &local_40);
    }
    else {
      CVar1 = FieldDescriptor::cpp_type(field);
      if (CVar1 == CPPTYPE_MESSAGE) {
        FieldName_abi_cxx11_(&local_40,(cpp *)field,field_01);
        io::Printer::Print(printer,"if ($prefix$has_$name$()) {\n","prefix",prefix,"name",&local_40)
        ;
      }
      else {
        FieldName_abi_cxx11_(&local_40,(cpp *)field,field_01);
        io::Printer::Print(printer,"if ($prefix$$name$() != 0) {\n","prefix",prefix,"name",&local_40
                          );
      }
    }
    goto LAB_00280f4e;
  }
  FieldName_abi_cxx11_(&local_40,(cpp *)field,field);
  io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_40);
LAB_00280f4e:
  std::__cxx11::string::~string((string *)&local_40);
  io::Printer::Indent(printer);
  return true;
}

Assistant:

bool EmitFieldNonDefaultCondition(io::Printer* printer,
                                  const string& prefix,
                                  const FieldDescriptor* field) {
  // Merge and serialize semantics: primitive fields are merged/serialized only
  // if non-zero (numeric) or non-empty (string).
  if (!field->is_repeated() && !field->containing_oneof()) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      printer->Print(
          "if ($prefix$$name$().size() > 0) {\n",
          "prefix", prefix,
          "name", FieldName(field));
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // Message fields still have has_$name$() methods.
      printer->Print(
          "if ($prefix$has_$name$()) {\n",
          "prefix", prefix,
          "name", FieldName(field));
    } else {
      printer->Print(
          "if ($prefix$$name$() != 0) {\n",
          "prefix", prefix,
          "name", FieldName(field));
    }
    printer->Indent();
    return true;
  } else if (field->containing_oneof()) {
    printer->Print(
        "if (has_$name$()) {\n",
        "name", FieldName(field));
    printer->Indent();
    return true;
  }
  return false;
}